

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-lstm.cc
# Opt level: O0

int __thiscall
dynet::FastLSTMBuilder::copy(FastLSTMBuilder *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  size_type sVar1;
  size_type sVar2;
  ostream *poVar3;
  invalid_argument *this_00;
  reference pvVar4;
  const_reference this_01;
  const_reference pvVar5;
  reference pvVar6;
  size_t j;
  size_t i;
  ostringstream oss;
  FastLSTMBuilder *rnn_lstm;
  ulong local_1d8;
  ulong local_1d0;
  string local_1c0 [48];
  ostringstream local_190 [376];
  EVP_PKEY_CTX *local_18;
  EVP_PKEY_CTX *local_10;
  FastLSTMBuilder *local_8;
  
  local_18 = dst;
  local_10 = dst;
  local_8 = this;
  sVar1 = std::
          vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
          ::size(&this->params);
  sVar2 = std::
          vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
          ::size((vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
                  *)(local_18 + 0xd0));
  if (sVar1 != sVar2) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    poVar3 = std::operator<<((ostream *)local_190,
                             "Attempt to copy FastLSTMBuilder with different number of parameters ("
                            );
    sVar1 = std::
            vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
            ::size(&this->params);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar1);
    poVar3 = std::operator<<(poVar3," != ");
    sVar1 = std::
            vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
            ::size((vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
                    *)(local_18 + 0xd0));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar1);
    std::operator<<(poVar3,")");
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::invalid_argument::invalid_argument(this_00,local_1c0);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_1d0 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
            ::size(&this->params);
    if (sVar1 <= local_1d0) break;
    local_1d8 = 0;
    while( true ) {
      pvVar4 = std::
               vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
               ::operator[](&this->params,local_1d0);
      sVar1 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::size(pvVar4);
      if (sVar1 <= local_1d8) break;
      this_01 = std::
                vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
                ::operator[]((vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
                              *)(local_18 + 0xd0),local_1d0);
      pvVar5 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[]
                         (this_01,local_1d8);
      pvVar4 = std::
               vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
               ::operator[](&this->params,local_1d0);
      pvVar6 = std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::operator[]
                         (pvVar4,local_1d8);
      pvVar6->p = pvVar5->p;
      local_1d8 = local_1d8 + 1;
    }
    local_1d0 = local_1d0 + 1;
  }
  return (int)local_1d0;
}

Assistant:

void FastLSTMBuilder::copy(const RNNBuilder & rnn) {
  const FastLSTMBuilder & rnn_lstm = (const FastLSTMBuilder&)rnn;
  DYNET_ARG_CHECK(params.size() == rnn_lstm.params.size(),
                          "Attempt to copy FastLSTMBuilder with different number of parameters "
                          "(" << params.size() << " != " << rnn_lstm.params.size() << ")");
  for(size_t i = 0; i < params.size(); ++i)
      for(size_t j = 0; j < params[i].size(); ++j)
        params[i][j] = rnn_lstm.params[i][j];
}